

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

void __thiscall AbstractModuleClient::sendTimeRateRequest(AbstractModuleClient *this)

{
  TrodesMsg msg;
  allocator local_71;
  string local_70;
  string local_50;
  TrodesMsg local_30;
  
  std::__cxx11::string::string((string *)&local_50,"s",&local_71);
  TrodesMsg::TrodesMsg<char_const*>(&local_30,&local_50,"infoTR");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,"info_req",&local_71);
  sendMsgToTrodes(this,&local_70,&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  TrodesMsg::~TrodesMsg(&local_30);
  return;
}

Assistant:

void AbstractModuleClient::sendTimeRateRequest(){
    TrodesMsg msg("s", INFO_TIMERATE);
    sendMsgToTrodes(TRODES_INFO_REQ, msg);
}